

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::print_listen_interfaces_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,
          vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
          *in)

{
  string *psVar1;
  char cVar2;
  listen_interface_t *i;
  string *str;
  error_code ec;
  address_v6 local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = *(string **)(this + 8);
  for (str = *(string **)this; str != psVar1; str = (string *)&str[1]._M_string_length) {
    cVar2 = (char)__return_storage_ptr__;
    if (__return_storage_ptr__->_M_string_length != 0) {
      ::std::__cxx11::string::push_back(cVar2);
    }
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    boost::asio::ip::make_address_v6(&local_48,str,&ec);
    if (ec.failed_ == false) {
      ::std::__cxx11::string::push_back(cVar2);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::push_back(cVar2);
    }
    else {
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::push_back(cVar2);
    to_string((array<char,_22UL> *)&local_48,(long)*(int *)&str[1]._M_dataplus._M_p);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (*(char *)((long)&str[1]._M_dataplus._M_p + 4) == '\x01') {
      ::std::__cxx11::string::push_back(cVar2);
    }
    if (*(char *)((long)&str[1]._M_dataplus._M_p + 5) == '\x01') {
      ::std::__cxx11::string::push_back(cVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_listen_interfaces(std::vector<listen_interface_t> const& in)
	{
		std::string ret;
		for (auto const& i : in)
		{
			if (!ret.empty()) ret += ',';

			error_code ec;
			make_address_v6(i.device, ec);
			if (!ec)
			{
				// IPv6 addresses must be wrapped in square brackets
				ret += '[';
				ret += i.device;
				ret += ']';
			}
			else
			{
				ret += i.device;
			}
			ret += ':';
			ret += to_string(i.port).data();
			if (i.ssl) ret += 's';
			if (i.local) ret += 'l';
		}

		return ret;
	}